

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::visit(Executor *this,FunctionDeclarationNode *node)

{
  bool bVar1;
  string *psVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  const_iterator symbol_00;
  FunctionDeclarationNode *in_RSI;
  long in_RDI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>
  *arg;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *__range1;
  __single_object symbol;
  TypeName type;
  string name;
  Argument *in_stack_ffffffffffffff28;
  pointer in_stack_ffffffffffffff30;
  shared_ptr<BlockNode> *in_stack_ffffffffffffff78;
  TypeName *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  _Self local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name_00;
  Context *in_stack_ffffffffffffffb0;
  string local_30 [32];
  FunctionDeclarationNode *local_10;
  
  local_10 = in_RSI;
  psVar2 = FunctionDeclarationNode::getName_abi_cxx11_(in_RSI);
  std::__cxx11::string::string(local_30,(string *)psVar2);
  FunctionDeclarationNode::getReturnType(local_10);
  this_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>
             *)FunctionDeclarationNode::getBody(local_10);
  std::
  make_unique<RuntimeFunctionSymbol,std::__cxx11::string_const&,TypeName_const&,std::shared_ptr<BlockNode>const&>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  __a = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        FunctionDeclarationNode::getArguments_abi_cxx11_(local_10);
  name_00 = __a;
  symbol_00 = std::__cxx11::
              list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
              ::begin((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                       *)in_stack_ffffffffffffff28);
  local_68._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
       ::end((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
              *)in_stack_ffffffffffffff28);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffa0,&local_68);
    if (!bVar1) break;
    std::
    _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
    ::operator*((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
                 *)in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff30 =
         std::unique_ptr<RuntimeFunctionSymbol,_std::default_delete<RuntimeFunctionSymbol>_>::
         operator->((unique_ptr<RuntimeFunctionSymbol,_std::default_delete<RuntimeFunctionSymbol>_>
                     *)0x18aec4);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName,_true>
              (this_00,__a,(TypeName *)in_stack_ffffffffffffff30);
    RuntimeFunctionSymbol::addArgument(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>
             *)0x18aefc);
    std::
    _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
    ::operator++((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
                  *)&stack0xffffffffffffffa0);
  }
  std::shared_ptr<RuntimeSymbol>::
  shared_ptr<RuntimeFunctionSymbol,std::default_delete<RuntimeFunctionSymbol>,void>
            ((shared_ptr<RuntimeSymbol> *)in_stack_ffffffffffffff30,
             (unique_ptr<RuntimeFunctionSymbol,_std::default_delete<RuntimeFunctionSymbol>_> *)
             (in_RDI + 0x10));
  Context::addSymbol(in_stack_ffffffffffffffb0,name_00,
                     (shared_ptr<RuntimeSymbol> *)symbol_00._M_node);
  std::shared_ptr<RuntimeSymbol>::~shared_ptr((shared_ptr<RuntimeSymbol> *)0x18afa0);
  std::unique_ptr<RuntimeFunctionSymbol,_std::default_delete<RuntimeFunctionSymbol>_>::~unique_ptr
            ((unique_ptr<RuntimeFunctionSymbol,_std::default_delete<RuntimeFunctionSymbol>_> *)
             in_stack_ffffffffffffff30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Executor::visit(const FunctionDeclarationNode& node)
{
  const auto name = node.getName();
  const auto type = node.getReturnType();
  auto symbol = std::make_unique<RuntimeFunctionSymbol>(name, type, node.getBody());
  for(const auto& arg : node.getArguments())
  {
    symbol->addArgument(RuntimeFunctionSymbol::Argument{arg.first, arg.second});
  }

  context_.addSymbol(name, std::move(symbol));
}